

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O0

char * ngx_http_charset_map_block(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  uint uVar1;
  ngx_int_t nVar2;
  ngx_int_t nVar3;
  void *pvVar4;
  undefined1 *puVar5;
  ngx_uint_t local_100;
  ngx_http_charset_conf_ctx_t ctx;
  ngx_http_charset_tables_t *table;
  ngx_http_charset_t *charset;
  ngx_conf_t pvcf;
  ngx_str_t *value;
  ngx_uint_t n;
  ngx_uint_t i;
  ngx_int_t dst;
  ngx_int_t src;
  u_char **pp;
  u_char *dst2src;
  u_char *p;
  char *rv;
  ngx_http_charset_main_conf_t *mcf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  pvcf.handler_conf = (char *)cf->args->elts;
  nVar2 = ngx_http_add_charset((ngx_array_t *)conf,(ngx_str_t *)(pvcf.handler_conf + 0x10));
  if (nVar2 == -1) {
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    nVar3 = ngx_http_add_charset((ngx_array_t *)conf,(ngx_str_t *)(pvcf.handler_conf + 0x20));
    if (nVar3 == -1) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else if (nVar2 == nVar3) {
      ngx_conf_log_error(1,cf,0,"\"charset_map\" between the same charsets \"%V\" and \"%V\"",
                         pvcf.handler_conf + 0x10,pvcf.handler_conf + 0x20);
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      ctx.characters = *(long *)((long)conf + 0x28);
      for (n = 0; n < *(ulong *)((long)conf + 0x30); n = n + 1) {
        if (((nVar2 == *(long *)ctx.characters) && (nVar3 == *(long *)(ctx.characters + 8))) ||
           ((nVar2 == *(long *)(ctx.characters + 8) && (nVar3 == *(long *)ctx.characters)))) {
          ngx_conf_log_error(1,cf,0,"duplicate \"charset_map\" between \"%V\" and \"%V\"",
                             pvcf.handler_conf + 0x10,pvcf.handler_conf + 0x20);
          return (char *)0xffffffffffffffff;
        }
      }
      ctx.characters = (ngx_uint_t)ngx_array_push((ngx_array_t *)((long)conf + 0x28));
      if ((ngx_int_t *)ctx.characters == (ngx_int_t *)0x0) {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
      else {
        *(ngx_int_t *)ctx.characters = nVar2;
        *(ngx_int_t *)(ctx.characters + 8) = nVar3;
        nVar2 = ngx_strcasecmp(*(u_char **)(pvcf.handler_conf + 0x28),(u_char *)"utf-8");
        if (nVar2 == 0) {
          pvVar4 = ngx_pcalloc(cf->pool,0x400);
          *(void **)(ctx.characters + 0x10) = pvVar4;
          if (*(long *)(ctx.characters + 0x10) == 0) {
            return (char *)0xffffffffffffffff;
          }
          pvVar4 = ngx_pcalloc(cf->pool,0x800);
          *(void **)(ctx.characters + 0x18) = pvVar4;
          if (*(long *)(ctx.characters + 0x18) == 0) {
            return (char *)0xffffffffffffffff;
          }
          pvVar4 = ngx_pcalloc(cf->pool,0x100);
          if (pvVar4 == (void *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          **(undefined8 **)(ctx.characters + 0x18) = pvVar4;
          for (n = 0; n < 0x80; n = n + 1) {
            puVar5 = (undefined1 *)(*(long *)(ctx.characters + 0x10) + n * 4);
            *puVar5 = 1;
            puVar5[1] = (char)n;
            *(char *)((long)pvVar4 + n) = (char)n;
          }
          for (; n < 0x100; n = n + 1) {
            puVar5 = (undefined1 *)(*(long *)(ctx.characters + 0x10) + n * 4);
            *puVar5 = 1;
            puVar5[1] = 0x3f;
          }
        }
        else {
          pvVar4 = ngx_palloc(cf->pool,0x100);
          *(void **)(ctx.characters + 0x10) = pvVar4;
          if (*(long *)(ctx.characters + 0x10) == 0) {
            return (char *)0xffffffffffffffff;
          }
          pvVar4 = ngx_palloc(cf->pool,0x100);
          *(void **)(ctx.characters + 0x18) = pvVar4;
          if (*(long *)(ctx.characters + 0x18) == 0) {
            return (char *)0xffffffffffffffff;
          }
          for (n = 0; n < 0x80; n = n + 1) {
            *(char *)(*(long *)(ctx.characters + 0x10) + n) = (char)n;
            *(char *)(*(long *)(ctx.characters + 0x18) + n) = (char)n;
          }
          for (; n < 0x100; n = n + 1) {
            *(undefined1 *)(*(long *)(ctx.characters + 0x10) + n) = 0x3f;
            *(undefined1 *)(*(long *)(ctx.characters + 0x18) + n) = 0x3f;
          }
        }
        local_100 = ctx.characters;
        ctx.table = (ngx_http_charset_tables_t *)(*conf + nVar3 * 0x20);
        ctx.charset = (ngx_http_charset_t *)0x0;
        memcpy(&charset,cf,0x60);
        cf->ctx = &local_100;
        cf->handler = ngx_http_charset_map;
        cf->handler_conf = (char *)conf;
        cf_local = (ngx_conf_t *)ngx_conf_parse(cf,(ngx_str_t *)0x0);
        memcpy(cf,&charset,0x60);
        if ((ctx.charset != (ngx_http_charset_t *)0x0) &&
           (uVar1 = *(uint *)&(ctx.table)->dst2src,
           *(uint *)&(ctx.table)->dst2src =
                *(uint *)&(ctx.table)->dst2src & 0xffff0000 |
                (uint)((ulong)(*(uint *)&(ctx.table)->dst2src & 0xffff) / (ulong)ctx.charset),
           4 < (((ulong)(uVar1 & 0xffff) * 10) / (ulong)ctx.charset) % 10)) {
          *(uint *)&(ctx.table)->dst2src =
               *(uint *)&(ctx.table)->dst2src & 0xffff0000 |
               (*(uint *)&(ctx.table)->dst2src & 0xffff) + 1 & 0xffff;
        }
      }
    }
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_charset_map_block(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_charset_main_conf_t  *mcf = conf;

    char                         *rv;
    u_char                       *p, *dst2src, **pp;
    ngx_int_t                     src, dst;
    ngx_uint_t                    i, n;
    ngx_str_t                    *value;
    ngx_conf_t                    pvcf;
    ngx_http_charset_t           *charset;
    ngx_http_charset_tables_t    *table;
    ngx_http_charset_conf_ctx_t   ctx;

    value = cf->args->elts;

    src = ngx_http_add_charset(&mcf->charsets, &value[1]);
    if (src == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    dst = ngx_http_add_charset(&mcf->charsets, &value[2]);
    if (dst == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    if (src == dst) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "\"charset_map\" between the same charsets "
                           "\"%V\" and \"%V\"", &value[1], &value[2]);
        return NGX_CONF_ERROR;
    }

    table = mcf->tables.elts;
    for (i = 0; i < mcf->tables.nelts; i++) {
        if ((src == table->src && dst == table->dst)
             || (src == table->dst && dst == table->src))
        {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "duplicate \"charset_map\" between "
                               "\"%V\" and \"%V\"", &value[1], &value[2]);
            return NGX_CONF_ERROR;
        }
    }

    table = ngx_array_push(&mcf->tables);
    if (table == NULL) {
        return NGX_CONF_ERROR;
    }

    table->src = src;
    table->dst = dst;

    if (ngx_strcasecmp(value[2].data, (u_char *) "utf-8") == 0) {
        table->src2dst = ngx_pcalloc(cf->pool, 256 * NGX_UTF_LEN);
        if (table->src2dst == NULL) {
            return NGX_CONF_ERROR;
        }

        table->dst2src = ngx_pcalloc(cf->pool, 256 * sizeof(void *));
        if (table->dst2src == NULL) {
            return NGX_CONF_ERROR;
        }

        dst2src = ngx_pcalloc(cf->pool, 256);
        if (dst2src == NULL) {
            return NGX_CONF_ERROR;
        }

        pp = (u_char **) &table->dst2src[0];
        pp[0] = dst2src;

        for (i = 0; i < 128; i++) {
            p = &table->src2dst[i * NGX_UTF_LEN];
            p[0] = '\1';
            p[1] = (u_char) i;
            dst2src[i] = (u_char) i;
        }

        for (/* void */; i < 256; i++) {
            p = &table->src2dst[i * NGX_UTF_LEN];
            p[0] = '\1';
            p[1] = '?';
        }

    } else {
        table->src2dst = ngx_palloc(cf->pool, 256);
        if (table->src2dst == NULL) {
            return NGX_CONF_ERROR;
        }

        table->dst2src = ngx_palloc(cf->pool, 256);
        if (table->dst2src == NULL) {
            return NGX_CONF_ERROR;
        }

        for (i = 0; i < 128; i++) {
            table->src2dst[i] = (u_char) i;
            table->dst2src[i] = (u_char) i;
        }

        for (/* void */; i < 256; i++) {
            table->src2dst[i] = '?';
            table->dst2src[i] = '?';
        }
    }

    charset = mcf->charsets.elts;

    ctx.table = table;
    ctx.charset = &charset[dst];
    ctx.characters = 0;

    pvcf = *cf;
    cf->ctx = &ctx;
    cf->handler = ngx_http_charset_map;
    cf->handler_conf = conf;

    rv = ngx_conf_parse(cf, NULL);

    *cf = pvcf;

    if (ctx.characters) {
        n = ctx.charset->length;
        ctx.charset->length /= ctx.characters;

        if (((n * 10) / ctx.characters) % 10 > 4) {
            ctx.charset->length++;
        }
    }

    return rv;
}